

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  long *plVar4;
  long lVar5;
  void *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GLchar *varyings [1];
  DIResult result;
  string local_350;
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [23];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  long local_30;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_EXT_geometry_shader");
  local_1a0[0]._M_allocated_capacity._0_7_ = 0x6f697372657623;
  local_1a0[0]._M_local_buf[7] = 'n';
  local_1a0[0]._8_7_ = 0x73652030313320;
  local_1a8 = (_func_int **)0xf;
  local_1a0[0]._M_local_buf[0xf] = '\0';
  local_1b0 = (undefined1  [8])local_1a0;
  plVar4 = (long *)std::__cxx11::string::append(local_1b0);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar6) {
    local_320[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_320[0]._8_8_ = plVar4[3];
    local_330 = (undefined1  [8])local_320;
  }
  else {
    local_320[0]._0_8_ = paVar6->_M_allocated_capacity;
    local_330 = (undefined1  [8])*plVar4;
  }
  local_328 = (_func_int **)plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,
                    CONCAT17(local_1a0[0]._M_local_buf[7],
                             (undefined7)local_1a0[0]._M_allocated_capacity) + 1);
  }
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1aee929);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_330,(string *)local_1b0,
                     &local_350,false);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,
                    CONCAT17(local_1a0[0]._M_local_buf[7],
                             (undefined7)local_1a0[0]._M_allocated_capacity) + 1);
  }
  if (local_330 != (undefined1  [8])local_320) {
    operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = "dataOut";
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (this_00,this->_program,1,(GLchar **)&local_350,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar5 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar5 == 0) {
    lVar5 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    __s = operator_new(0x4000);
    memset(__s,0,0x4000);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x1000,__s,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x1000,__s,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData(this_00,0x8893,0x1000,__s,0x88e4);
    buffers = &this->_xfb;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x1000,__s,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*buffers);
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    local_30 = 0;
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        local_30 = -1;
        local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_330,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger((DILogger *)local_330);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        local_30 = -1;
        local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_330,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger((DILogger *)local_330);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,&this->_xfo);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->_xfo);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*buffers);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glPauseTransformFeedback(this_00);
    glu::CallLogWrapper::glResumeTransformFeedback(this_00);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        local_30 = -1;
        local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_330,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger((DILogger *)local_330);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        local_30 = -1;
        local_330 = (undefined1  [8])((ulong)local_330 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_330,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger((DILogger *)local_330);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
    lVar5 = local_30;
    DILogger::~DILogger((DILogger *)local_1b0);
    operator_delete(__s,0x4000);
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		api::ES_Only();

		bool drawWithXFBAllowed = m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader");

		_program				 = CreateProgram(Vsh(), "", shaders::fshSimple<api>(), false);
		const GLchar* varyings[] = { "dataOut" };
		glTransformFeedbackVaryings(_program, 1, varyings, GL_INTERLEAVED_ATTRIBS);
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		std::vector<GLuint> zarro(4096, 0);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);
		glBufferData(GL_ARRAY_BUFFER, 4096, &zarro[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_xfb);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, _xfb);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);

		DIResult result;

		//Without XFO
		glBeginTransformFeedback(GL_POINTS);

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		//With XFO
		glGenTransformFeedbacks(1, &_xfo);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, _xfo);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);
		glBeginTransformFeedback(GL_POINTS);
		glPauseTransformFeedback();
		glResumeTransformFeedback();

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		return result.code();
	}